

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binds.cpp
# Opt level: O0

int CBinds::GetModifierMaskOfKey(int Key)

{
  int Key_local;
  int local_4;
  
  switch(Key) {
  case 0x160:
  case 0x164:
    local_4 = 4;
    break;
  case 0x161:
  case 0x165:
    local_4 = 2;
    break;
  case 0x162:
    local_4 = 8;
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CBinds::GetModifierMaskOfKey(int Key)
{
	switch(Key)
	{
		case KEY_LSHIFT:
		case KEY_RSHIFT:
			return 1 << CBinds::MODIFIER_SHIFT;
		case KEY_LCTRL:
		case KEY_RCTRL:
			return 1 << CBinds::MODIFIER_CTRL;
		case KEY_LALT:
			return 1 << CBinds::MODIFIER_ALT;
		default:
			return 0;
	}
}